

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  byte *pbVar1;
  stbi__context *psVar2;
  bool bVar3;
  stbi_uc **ppsVar4;
  stbi_uc sVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  size_t __n;
  stbi_uc *psVar15;
  byte bVar16;
  stbi_uc *psVar17;
  uint uVar18;
  stbi__png *a;
  uint uVar19;
  stbi__uint32 raw_len_00;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  stbi_uc asStack_4e8 [8];
  stbi_uc palette [1024];
  stbi__uint32 local_dc;
  int local_d8;
  stbi__uint32 raw_len;
  ulong local_d0;
  undefined8 local_c8;
  stbi__png *local_c0;
  stbi_uc *local_b8;
  stbi_uc *local_b0;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  size_t local_98;
  stbi_uc **local_90;
  ulong local_88;
  int local_7c;
  ulong local_78;
  uint local_70;
  undefined4 uStack_6c;
  stbi_uc *local_68;
  stbi_uc *local_60;
  long *local_58;
  stbi_uc local_4b [3];
  stbi_uc *psStack_48;
  stbi_uc tc [3];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar7 = stbi__check_png_header(s);
  if (iVar7 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  local_58 = (long *)CONCAT44(local_58._4_4_,scan);
  local_90 = &z->idata;
  local_60 = s->buffer_start;
  local_68 = s->buffer_start + 1;
  local_88 = 0;
  bVar3 = true;
  local_d0 = 0;
  local_a0 = 0;
  local_7c = 0;
  local_70 = 0;
  uStack_6c = 0;
  local_98 = 0;
  psStack_48 = (stbi_uc *)0x0;
  local_c8 = 0;
  bVar22 = 0;
  local_c0 = z;
  local_a8 = req_comp;
  do {
    iVar7 = stbi__get16be(s);
    uVar8 = stbi__get16be(s);
    local_78 = (ulong)(iVar7 * 0x10000 + uVar8);
    uVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    psVar15 = local_60;
    psVar13 = local_68;
    ppsVar4 = local_90;
    uVar18 = uVar9 << 0x10 | uVar10;
    uVar11 = (uint)local_78;
    if ((int)uVar18 < 0x49484452) {
      if (uVar18 == 0x43674249) {
        local_7c = 1;
      }
      else {
        iVar7 = (int)psStack_48;
        if (uVar18 == 0x49444154) {
          if (bVar3) goto LAB_001209cc;
          if ((bVar22 != 0) && (local_70 == 0)) {
            stbi__g_failure_reason = "no PLTE";
            return 0;
          }
          if ((int)local_58 == 2) {
            s->img_n = (uint)bVar22;
            return 1;
          }
          uVar8 = (uint)local_78 + iVar7;
          if ((int)uVar8 < iVar7) {
            return 0;
          }
          if ((uint)local_98 < uVar8) {
            uVar20 = 0x1000;
            if (0x1000 < (uint)local_78) {
              uVar20 = local_78 & 0xffffffff;
            }
            if ((uint)local_98 != 0) {
              uVar20 = local_98 & 0xffffffff;
            }
            do {
              local_98 = uVar20;
              uVar20 = (ulong)((uint)local_98 * 2);
            } while ((uint)local_98 < uVar8);
            psVar13 = (stbi_uc *)realloc(*local_90,local_98);
            if (psVar13 == (stbi_uc *)0x0) goto LAB_00120f5e;
            *ppsVar4 = psVar13;
          }
          else {
            psVar13 = *local_90;
          }
          iVar7 = stbi__getn(s,psVar13 + ((ulong)psStack_48 & 0xffffffff),uVar11);
          bVar3 = false;
          if (iVar7 == 0) {
            stbi__g_failure_reason = "outofdata";
            return 0;
          }
          goto LAB_0012069f;
        }
        if (uVar18 == 0x49454e44) {
          if (bVar3) goto LAB_001209cc;
          if ((int)local_58 != 0) {
            return 1;
          }
          if (*local_90 == (stbi_uc *)0x0) {
            stbi__g_failure_reason = "no IDAT";
            return 0;
          }
          local_dc = s->img_n * s->img_y * (s->img_x * (int)local_a0 + 7 >> 3) + s->img_y;
          psVar13 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*local_90,iVar7,local_dc,(int *)&local_dc,
                               (uint)(local_7c == 0));
          a = local_c0;
          local_c0->expanded = psVar13;
          if (psVar13 == (stbi_uc *)0x0) {
            return 0;
          }
          free(local_c0->idata);
          raw_len_00 = local_dc;
          a->idata = (stbi_uc *)0x0;
          uVar11 = s->img_n + 1;
          uVar8 = s->img_n;
          if ((char)local_c8 != '\0') {
            uVar8 = uVar11;
          }
          uVar9 = uVar8;
          if (local_a8 != 3) {
            uVar9 = uVar11;
          }
          if (bVar22 != 0) {
            uVar9 = uVar8;
          }
          if (uVar11 != local_a8) {
            uVar9 = uVar8;
          }
          s->img_out_n = uVar9;
          local_b8 = a->expanded;
          x = a->s->img_x;
          y = a->s->img_y;
          if ((int)local_88 == 0) {
            iVar7 = stbi__create_png_image_raw
                              (a,local_b8,local_dc,uVar9,x,y,(int)local_a0,(int)local_d0);
            if (iVar7 == 0) {
              return 0;
            }
          }
          else {
            local_b0 = (stbi_uc *)malloc((ulong)(x * uVar9 * y));
            __n = (size_t)(int)uVar9;
            lVar24 = 0;
            local_a4 = uVar9;
            do {
              psVar2 = a->s;
              local_60 = (stbi_uc *)(long)(int)(&DAT_00138d70)[lVar24];
              uVar11 = (&DAT_00138db0)[lVar24];
              uVar19 = ~(&DAT_00138d70)[lVar24] + psVar2->img_x + uVar11;
              uVar9 = uVar19 / uVar11;
              local_98 = CONCAT44(local_98._4_4_,uVar9);
              local_70 = (&DAT_00138d90)[lVar24];
              uVar8 = (&DAT_00138dd0)[lVar24];
              uVar18 = ~local_70 + psVar2->img_y + uVar8;
              uVar10 = uVar18 / uVar8;
              local_88 = CONCAT44(local_88._4_4_,uVar10);
              if ((uVar11 <= uVar19) && (uVar8 <= uVar18)) {
                local_d8 = uVar9 * (int)local_a0 * psVar2->img_n;
                palette._1016_8_ = lVar24;
                iVar7 = stbi__create_png_image_raw
                                  (a,local_b8,raw_len_00,local_a4,uVar9,uVar10,(int)local_a0,
                                   (int)local_d0);
                if (iVar7 == 0) {
                  free(local_b0);
                  return 0;
                }
                raw_len = raw_len_00;
                if (0 < (int)uVar10) {
                  lVar24 = (long)(int)local_98;
                  local_90 = (stbi_uc **)(local_88 & 0xffffffff);
                  local_60 = local_b0 + (long)local_60 * __n;
                  local_70 = local_70 * local_a4;
                  local_58 = (long *)0x0;
                  local_68 = (stbi_uc *)CONCAT44(local_68._4_4_,uVar8 * local_a4);
                  do {
                    if (0 < (int)local_98) {
                      psStack_48 = local_c0->out;
                      local_78 = (long)local_58 * lVar24;
                      psVar13 = local_60 + local_c0->s->img_x * local_70;
                      lVar21 = 0;
                      do {
                        memcpy(psVar13,psStack_48 + (lVar21 + local_78) * __n,__n);
                        lVar21 = lVar21 + 1;
                        psVar13 = psVar13 + (long)(int)uVar11 * __n;
                      } while (lVar21 < lVar24);
                    }
                    local_58 = (long *)((long)local_58 + 1);
                    local_70 = local_70 + (int)local_68;
                  } while (local_58 < local_90);
                }
                a = local_c0;
                uVar11 = ((local_d8 + 7 >> 3) + 1) * (int)local_88;
                free(local_c0->out);
                local_b8 = local_b8 + uVar11;
                raw_len_00 = raw_len - uVar11;
                lVar24 = palette._1016_8_;
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != 7);
            a->out = local_b0;
          }
          if ((char)local_c8 != '\0') {
            psVar13 = a->out;
            iVar7 = a->s->img_y * a->s->img_x;
            if (s->img_out_n == 2) {
              if (iVar7 != 0) {
                lVar24 = 0;
                do {
                  psVar13[lVar24 * 2 + 1] = -(psVar13[lVar24 * 2] != local_4b[0]);
                  lVar24 = lVar24 + 1;
                } while (iVar7 != (int)lVar24);
              }
            }
            else {
              if (s->img_out_n != 4) {
                __assert_fail("out_n == 2 || out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                              ,0x1059,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)")
                ;
              }
              if (iVar7 != 0) {
                lVar24 = 0;
                do {
                  if (((psVar13[lVar24 * 4] == local_4b[0]) &&
                      (psVar13[lVar24 * 4 + 1] == local_4b[1])) &&
                     (psVar13[lVar24 * 4 + 2] == local_4b[2])) {
                    psVar13[lVar24 * 4 + 3] = '\0';
                  }
                  lVar24 = lVar24 + 1;
                } while (iVar7 != (int)lVar24);
              }
            }
          }
          if (((local_7c != 0) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
            stbi__de_iphone((stbi__png *)a->s);
          }
          if (bVar22 != 0) {
            s->img_n = (uint)bVar22;
            uVar11 = (uint)bVar22;
            if (2 < (int)local_a8) {
              uVar11 = local_a8;
            }
            s->img_out_n = uVar11;
            psVar13 = a->out;
            uVar8 = a->s->img_y * a->s->img_x;
            psVar15 = (stbi_uc *)malloc((ulong)(uVar8 * uVar11));
            if (psVar15 == (stbi_uc *)0x0) {
LAB_00120f5e:
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            if (uVar11 == 3) {
              if (uVar8 != 0) {
                uVar20 = 0;
                psVar17 = psVar15;
                do {
                  uVar23 = (ulong)psVar13[uVar20];
                  *psVar17 = asStack_4e8[uVar23 * 4];
                  psVar17[1] = asStack_4e8[uVar23 * 4 + 1];
                  psVar17[2] = asStack_4e8[uVar23 * 4 + 2];
                  psVar17 = psVar17 + 3;
                  uVar20 = uVar20 + 1;
                } while (uVar8 != uVar20);
              }
            }
            else if (uVar8 != 0) {
              uVar20 = 0;
              do {
                uVar23 = (ulong)psVar13[uVar20];
                psVar15[uVar20 * 4] = asStack_4e8[uVar23 * 4];
                psVar15[uVar20 * 4 + 1] = asStack_4e8[uVar23 * 4 + 1];
                psVar15[uVar20 * 4 + 2] = asStack_4e8[uVar23 * 4 + 2];
                psVar15[uVar20 * 4 + 3] = asStack_4e8[uVar23 * 4 + 3];
                uVar20 = uVar20 + 1;
              } while (uVar8 != uVar20);
            }
            free(psVar13);
            a->out = psVar15;
          }
          free(a->expanded);
          a->expanded = (stbi_uc *)0x0;
          return 1;
        }
LAB_00120673:
        if (bVar3) {
LAB_001209cc:
          stbi__g_failure_reason = "first not IHDR";
          return 0;
        }
        bVar3 = false;
        if ((uVar9 >> 0xd & 1) == 0) {
          stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
          stbi__parse_png_file::invalid_chunk[0] = (char)(uVar9 >> 8);
          stbi__parse_png_file::invalid_chunk[1] = (char)uVar9;
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar10 >> 8);
          stbi__parse_png_file::invalid_chunk[3] = (char)uVar10;
          return 0;
        }
      }
      stbi__skip(s,(uint)local_78);
LAB_00120699:
      uVar8 = (uint)psStack_48;
    }
    else {
      if (uVar18 == 0x74524e53) {
        if (bVar3) goto LAB_001209cc;
        if (*local_90 != (stbi_uc *)0x0) {
          stbi__g_failure_reason = "tRNS after IDAT";
          return 0;
        }
        if (bVar22 == 0) {
          uVar11 = s->img_n;
          if ((uVar11 & 1) == 0) {
            stbi__g_failure_reason = "tRNS with alpha";
            return 0;
          }
          if (uVar11 * 2 != (uint)local_78) goto LAB_00120a47;
          local_c8 = CONCAT71((uint7)(uint3)(uVar11 * 2 >> 8),1);
          if (0 < (int)uVar11) {
            uVar20 = local_a0 & 0xffffffff;
            lVar24 = 0;
            do {
              iVar7 = stbi__get16be(s);
              local_4b[lVar24] = ""[uVar20] * (char)iVar7;
              lVar24 = lVar24 + 1;
            } while (lVar24 < s->img_n);
          }
          bVar3 = false;
          uVar8 = (uint)psStack_48;
          bVar22 = 0;
          goto LAB_0012069f;
        }
        if ((int)local_58 == 2) {
          s->img_n = 4;
          return 1;
        }
        if (local_70 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if (local_70 < (uint)local_78) {
LAB_00120a47:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        bVar22 = 4;
        bVar3 = false;
        if ((uint)local_78 != 0) {
          psVar17 = s->img_buffer;
          psVar14 = s->img_buffer_end;
          uVar20 = 0;
          do {
            if (psVar17 < psVar14) {
              s->img_buffer = psVar17 + 1;
              sVar5 = *psVar17;
              psVar17 = psVar17 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar5 = '\0';
            }
            else {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar5 = '\0';
                psVar14 = psVar13;
              }
              else {
                sVar5 = *psVar15;
                psVar14 = psVar15 + iVar12;
              }
              s->img_buffer_end = psVar14;
              s->img_buffer = psVar13;
              psVar17 = psVar13;
            }
            asStack_4e8[uVar20 * 4 + 3] = sVar5;
            uVar20 = uVar20 + 1;
          } while (uVar8 + iVar7 * 0x10000 != uVar20);
        }
        goto LAB_00120699;
      }
      if (uVar18 == 0x504c5445) {
        if (bVar3) goto LAB_001209cc;
        if (0x300 < (uint)local_78) {
LAB_001209a9:
          stbi__g_failure_reason = "invalid PLTE";
          return 0;
        }
        local_70 = uVar8 * 0xaaab >> 0x11;
        uStack_6c = 0;
        if (local_70 * 3 != (uint)local_78) goto LAB_001209a9;
        bVar3 = false;
        if (2 < uVar8) {
          uVar20 = (ulong)local_70;
          psVar17 = s->img_buffer;
          psVar14 = s->img_buffer_end;
          uVar23 = 0;
          do {
            if (psVar17 < psVar14) {
              s->img_buffer = psVar17 + 1;
              sVar5 = *psVar17;
              psVar17 = psVar17 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar5 = '\0';
            }
            else {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar5 = '\0';
                psVar14 = psVar13;
              }
              else {
                sVar5 = *psVar15;
                psVar14 = psVar15 + iVar7;
              }
              s->img_buffer_end = psVar14;
              s->img_buffer = psVar13;
              psVar17 = psVar13;
            }
            asStack_4e8[uVar23 * 4] = sVar5;
            if (psVar17 < psVar14) {
              s->img_buffer = psVar17 + 1;
              sVar5 = *psVar17;
              psVar17 = psVar17 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar5 = '\0';
            }
            else {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar5 = '\0';
                psVar14 = psVar13;
              }
              else {
                sVar5 = *psVar15;
                psVar14 = psVar15 + iVar7;
              }
              s->img_buffer_end = psVar14;
              s->img_buffer = psVar13;
              psVar17 = psVar13;
            }
            asStack_4e8[uVar23 * 4 + 1] = sVar5;
            if (psVar17 < psVar14) {
              s->img_buffer = psVar17 + 1;
              sVar5 = *psVar17;
              psVar17 = psVar17 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar5 = '\0';
            }
            else {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar15,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar5 = '\0';
                psVar14 = psVar13;
              }
              else {
                sVar5 = *psVar15;
                psVar14 = psVar15 + iVar7;
              }
              s->img_buffer_end = psVar14;
              s->img_buffer = psVar13;
              psVar17 = psVar13;
            }
            asStack_4e8[uVar23 * 4 + 2] = sVar5;
            asStack_4e8[uVar23 * 4 + 3] = 0xff;
            uVar23 = uVar23 + 1;
          } while (uVar20 != uVar23);
        }
        goto LAB_00120699;
      }
      if (uVar18 != 0x49484452) goto LAB_00120673;
      if (!bVar3) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if ((uint)local_78 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      iVar7 = stbi__get16be(s);
      uVar11 = stbi__get16be(s);
      uVar11 = uVar11 | iVar7 << 0x10;
      s->img_x = uVar11;
      if (0x1000000 < uVar11) {
LAB_001209a0:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      iVar7 = stbi__get16be(s);
      uVar11 = stbi__get16be(s);
      psVar15 = local_60;
      psVar13 = local_68;
      uVar11 = uVar11 | iVar7 << 0x10;
      s->img_y = uVar11;
      if (0x1000000 < uVar11) goto LAB_001209a0;
      pbVar1 = s->img_buffer;
      psVar17 = s->img_buffer_end;
      iVar7 = (int)local_58;
      if (pbVar1 < psVar17) {
        s->img_buffer = pbVar1 + 1;
        bVar16 = *pbVar1;
        psVar15 = pbVar1 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00120a80;
        iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_60,s->buflen);
        if (iVar12 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar16 = 0;
          psVar17 = psVar13;
        }
        else {
          bVar16 = *psVar15;
          psVar17 = psVar15 + iVar12;
        }
        s->img_buffer_end = psVar17;
        s->img_buffer = psVar13;
        psVar15 = psVar13;
      }
      psVar14 = local_60;
      if ((8 < bVar16) || (local_a0 = (ulong)bVar16, (0x116U >> (bVar16 & 0x1f) & 1) == 0)) {
LAB_00120a80:
        stbi__g_failure_reason = "1/2/4/8-bit only";
        return 0;
      }
      if (psVar15 < psVar17) {
        psVar13 = psVar15 + 1;
        s->img_buffer = psVar13;
        bVar16 = *psVar15;
LAB_00120841:
        if (6 < bVar16) {
LAB_001209bb:
          stbi__g_failure_reason = "bad ctype";
          return 0;
        }
        psVar15 = psVar13;
        if (bVar16 == 3) {
          uVar20 = 3;
          bVar16 = 3;
          bVar22 = 3;
        }
        else {
          if ((bVar16 & 1) != 0) goto LAB_001209bb;
          uVar20 = (ulong)bVar16;
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_60,s->buflen);
          if (iVar12 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar16 = 0;
            psVar17 = psVar13;
          }
          else {
            bVar16 = *psVar14;
            psVar17 = psVar14 + iVar12;
          }
          s->img_buffer_end = psVar17;
          s->img_buffer = psVar13;
          goto LAB_00120841;
        }
        bVar16 = 0;
        uVar20 = 0;
      }
      psVar13 = local_60;
      if (psVar15 < psVar17) {
        s->img_buffer = psVar15 + 1;
        sVar5 = *psVar15;
LAB_001208d3:
        if (sVar5 != '\0') {
          stbi__g_failure_reason = "bad comp method";
          return 0;
        }
      }
      else if (s->read_from_callbacks != 0) {
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)local_60,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar5 = '\0';
          psVar13 = local_68;
        }
        else {
          sVar5 = *psVar13;
          psVar13 = psVar13 + iVar7;
        }
        s->img_buffer_end = psVar13;
        s->img_buffer = local_68;
        iVar7 = (int)local_58;
        goto LAB_001208d3;
      }
      sVar5 = stbi__get8(s);
      if (sVar5 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar6 = stbi__get8(s);
      if (1 < bVar6) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar11 = s->img_x;
      if ((uVar11 == 0) || (uVar9 = s->img_y, uVar9 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      local_88 = (ulong)bVar6;
      uVar8 = (uint)psStack_48;
      local_d0 = uVar20;
      if (bVar22 == 0) {
        uVar10 = (uint)(3 < bVar16) + ((uint)uVar20 & 2) + 1;
        s->img_n = uVar10;
        if ((uint)((0x40000000 / (ulong)uVar11) / (ulong)uVar10) < uVar9) goto LAB_001209a0;
        bVar3 = false;
        bVar22 = 0;
        if (iVar7 == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar3 = false;
        if ((uint)(0x40000000 / (ulong)uVar11 >> 2) < uVar9) goto LAB_001209a0;
      }
    }
LAB_0012069f:
    stbi__get16be(s);
    stbi__get16be(s);
    psStack_48 = (stbi_uc *)(ulong)uVar8;
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, depth=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            depth = stbi__get8(s);  if (depth != 1 && depth != 2 && depth != 4 && depth != 8)  return stbi__err("1/2/4/8-bit only","PNG not supported: 1/2/4/8-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (stbi_uc) (stbi__get16be(s) & 255) * stbi__depth_scale_table[depth]; // non 8-bit images will be larger
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (stbi_uc *) STBI_REALLOC(z->idata, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, depth, color, interlace)) return 0;
            if (has_trans)
               if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}